

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_schema.c
# Opt level: O2

lys_node *
lys_node_dup_recursion
          (lys_module *module,lys_node *parent,lys_node *node,unres_schema *unres,int shallow,
          int finalize)

{
  uint8_t uVar1;
  byte bVar2;
  LYS_NODE LVar3;
  lys_node *plVar4;
  uint8_t uVar5;
  uint8_t uVar6;
  uint8_t uVar7;
  uint8_t uVar8;
  uint8_t uVar9;
  ushort uVar10;
  int iVar11;
  int iVar12;
  lys_node *plVar13;
  char *pcVar14;
  lys_iffeature *plVar15;
  lys_restr *plVar16;
  lys_node *plVar17;
  uint8_t *__dest;
  lys_feature **pplVar18;
  LY_ERR *pLVar19;
  lys_node_list *node_00;
  lys_node_list *plVar20;
  lys_node *plVar21;
  lys_node *plVar22;
  lys_when *plVar23;
  void *pvVar24;
  lys_module *plVar25;
  lys_ext_instance **pplVar26;
  lys_ext_instance *plVar27;
  lys_ext *plVar28;
  undefined8 *new_item;
  lys_node *plVar29;
  undefined8 uVar30;
  lys_node *plVar31;
  lys_node *new_item_00;
  lys_node *plVar32;
  ulong uVar33;
  ulong __nmemb;
  ulong uVar34;
  lys_node **pplVar35;
  ly_ctx *ctx;
  long lVar36;
  lys_iffeature *plVar37;
  size_t sStackY_e0;
  uint local_9c;
  lys_node *plStack_98;
  uint size1;
  lys_node_list *list_orig;
  lys_node *local_88;
  lys_node *local_80;
  uint local_78;
  int local_74;
  uint size2;
  uint local_6c;
  lys_module *local_68;
  lys_node *local_60;
  ly_ctx *local_58;
  lys_node *local_50;
  lys_node *local_48;
  lys_node *local_40;
  lys_node *local_38;
  
  ctx = module->ctx;
  LVar3 = node->nodetype;
  plStack_98 = node;
  list_orig = (lys_node_list *)parent;
  local_74 = shallow;
  size2 = finalize;
  switch(LVar3) {
  case LYS_CONTAINER:
    plVar13 = (lys_node *)calloc(1,0x88);
    local_80 = (lys_node *)0x0;
    plVar22 = plVar13;
    break;
  case LYS_CHOICE:
    plVar13 = (lys_node *)calloc(1,0x78);
    plVar22 = (lys_node *)0x0;
    local_80 = plVar13;
    break;
  case LYS_CHOICE|LYS_CONTAINER:
  case LYS_LEAF|LYS_CONTAINER:
  case LYS_LEAF|LYS_CHOICE:
  case LYS_LEAF|LYS_CHOICE|LYS_CONTAINER:
switchD_00152940_caseD_3:
    pLVar19 = ly_errno_location();
    *pLVar19 = LY_EINT;
    plVar13 = (lys_node *)0x0;
    uVar30 = 0xaf1;
    goto LAB_001529b2;
  case LYS_LEAF:
    plVar13 = (lys_node *)calloc(1,200);
    plVar22 = (lys_node *)0x0;
    local_80 = (lys_node *)0x0;
    local_50 = plVar13;
    goto LAB_00152a10;
  case LYS_LEAFLIST:
    plVar13 = (lys_node *)calloc(1,0xd0);
    plVar22 = (lys_node *)0x0;
    local_80 = (lys_node *)0x0;
    local_50 = (lys_node *)0x0;
    local_38 = (lys_node *)0x0;
    plVar21 = (lys_node *)0x0;
    local_88 = (lys_node *)0x0;
    local_48 = plVar13;
    goto LAB_00152a29;
  default:
    if (LVar3 == LYS_LIST) {
      plVar13 = (lys_node *)calloc(1,0xa0);
      plVar22 = (lys_node *)0x0;
      local_80 = (lys_node *)0x0;
      local_50 = (lys_node *)0x0;
      local_48 = (lys_node *)0x0;
      plVar21 = (lys_node *)0x0;
      local_88 = (lys_node *)0x0;
      local_38 = plVar13;
      goto LAB_00152a29;
    }
    if (LVar3 == LYS_ANYXML) {
LAB_00152909:
      plVar13 = (lys_node *)calloc(1,0x78);
      plVar22 = (lys_node *)0x0;
      local_80 = (lys_node *)0x0;
      local_50 = (lys_node *)0x0;
      plVar21 = plVar13;
      goto LAB_00152a23;
    }
    if (LVar3 != LYS_CASE) {
      if (LVar3 == LYS_NOTIF) {
LAB_00152959:
        sStackY_e0 = 0x78;
LAB_00152965:
        plVar13 = (lys_node *)calloc(1,sStackY_e0);
        plVar22 = (lys_node *)0x0;
        local_80 = (lys_node *)0x0;
        local_50 = (lys_node *)0x0;
        local_48 = (lys_node *)0x0;
        local_38 = (lys_node *)0x0;
        plVar21 = (lys_node *)0x0;
        local_88 = (lys_node *)0x0;
        goto LAB_00152a29;
      }
      if (LVar3 == LYS_RPC) {
LAB_00152960:
        sStackY_e0 = 0x70;
        goto LAB_00152965;
      }
      if ((LVar3 == LYS_INPUT) || (LVar3 == LYS_OUTPUT)) goto LAB_00152959;
      if (LVar3 != LYS_USES) {
        if (LVar3 != LYS_ACTION) {
          if (LVar3 != LYS_ANYDATA) goto switchD_00152940_caseD_3;
          goto LAB_00152909;
        }
        goto LAB_00152960;
      }
      plVar13 = (lys_node *)calloc(1,0x88);
      plVar22 = (lys_node *)0x0;
      local_80 = (lys_node *)0x0;
      local_50 = (lys_node *)0x0;
      plVar21 = (lys_node *)0x0;
      local_88 = plVar13;
      goto LAB_00152a26;
    }
    plVar17 = (lys_node *)calloc(1,0x70);
    plVar22 = (lys_node *)0x0;
    local_80 = (lys_node *)0x0;
    local_50 = (lys_node *)0x0;
    local_48 = (lys_node *)0x0;
    local_38 = (lys_node *)0x0;
    plVar21 = (lys_node *)0x0;
    local_88 = (lys_node *)0x0;
    plVar13 = plVar17;
    goto LAB_00152a2b;
  }
  local_50 = (lys_node *)0x0;
LAB_00152a10:
  plVar21 = (lys_node *)0x0;
LAB_00152a23:
  local_88 = (lys_node *)0x0;
LAB_00152a26:
  local_38 = (lys_node *)0x0;
  local_48 = (lys_node *)0x0;
LAB_00152a29:
  plVar17 = (lys_node *)0x0;
LAB_00152a2b:
  if (plVar13 == (lys_node *)0x0) {
    pLVar19 = ly_errno_location();
    *pLVar19 = LY_EMEM;
    ly_log(LY_LLERR,"Memory allocation failed (%s()).","lys_node_dup_recursion");
    return (lys_node *)0x0;
  }
  pcVar14 = lydict_insert(ctx,node->name,0);
  plVar13->name = pcVar14;
  pcVar14 = lydict_insert(ctx,node->dsc,0);
  plVar13->dsc = pcVar14;
  pcVar14 = lydict_insert(ctx,node->ref,0);
  plVar13->ref = pcVar14;
  plVar13->flags = node->flags;
  plVar13->module = module;
  plVar13->nodetype = node->nodetype;
  plVar13->prev = plVar13;
  uVar1 = node->ext_size;
  plVar13->ext_size = uVar1;
  iVar11 = lys_ext_dup(module,node->ext,uVar1,plVar13,LYEXT_PAR_NODE,&plVar13->ext,unres);
  if (iVar11 != 0) goto LAB_00152acc;
  bVar2 = node->iffeature_size;
  if ((ulong)bVar2 == 0) {
LAB_00152b3a:
    local_68 = module;
    local_60 = plVar13;
    local_40 = node;
    if (local_74 == 0) {
      uVar34 = 0;
      local_6c = 1;
      local_58 = ctx;
      do {
        plVar4 = local_40;
        plVar20 = list_orig;
        if (local_40->iffeature_size <= uVar34) goto LAB_00152ec4;
        resolve_iffeature_getsizes(local_40->iffeature + uVar34,&local_9c,&local_78);
        plVar15 = plVar4->iffeature;
        plVar37 = plVar13->iffeature;
        if (local_9c != 0) {
          uVar33 = (ulong)((local_9c & 3) != 0 || local_9c >> 2 != 0);
          __dest = (uint8_t *)malloc(uVar33);
          plVar37[uVar34].expr = __dest;
          memcpy(__dest,plVar15[uVar34].expr,uVar33);
          __nmemb = (ulong)local_78;
          pplVar18 = (lys_feature **)calloc(__nmemb,8);
          plVar37[uVar34].features = pplVar18;
          lVar36 = 0;
          for (uVar33 = 0; plVar13 = local_60, plVar15 = local_40->iffeature, uVar33 < __nmemb;
              uVar33 = uVar33 + 1) {
            iVar11 = unres_schema_dup(local_68,unres,
                                      (void *)((long)plVar15[uVar34].features + lVar36),UNRES_IFFEAT
                                      ,(void *)((long)local_60->iffeature[uVar34].features + lVar36)
                                     );
            if (iVar11 == 1) {
              *(undefined8 *)((long)plVar13->iffeature[uVar34].features + lVar36) =
                   *(undefined8 *)((long)local_40->iffeature[uVar34].features + lVar36);
            }
            else if (iVar11 == -1) goto LAB_00152acc;
            __nmemb = (ulong)local_78;
            lVar36 = lVar36 + 8;
          }
          plVar37 = local_60->iffeature;
        }
        module = local_68;
        uVar1 = plVar15[uVar34].ext_size;
        plVar37[uVar34].ext_size = uVar1;
        iVar11 = lys_ext_dup(local_68,plVar15[uVar34].ext,uVar1,plVar37 + uVar34,LYEXT_PAR_IFFEATURE
                             ,&plVar37[uVar34].ext,unres);
        uVar34 = uVar34 + 1;
      } while (iVar11 == 0);
      goto LAB_00152acc;
    }
    memcpy(plVar13->iffeature,node->iffeature,(ulong)plVar13->iffeature_size << 5);
    plVar31 = local_50;
    new_item_00 = local_80;
    plVar32 = local_88;
    goto LAB_00152b71;
  }
  plVar13->iffeature_size = bVar2;
  plVar15 = (lys_iffeature *)calloc((ulong)bVar2,0x20);
  plVar13->iffeature = plVar15;
  if (plVar15 != (lys_iffeature *)0x0) goto LAB_00152b3a;
LAB_00153420:
  pLVar19 = ly_errno_location();
  *pLVar19 = LY_EMEM;
  ly_log(LY_LLERR,"Memory allocation failed (%s()).","lys_node_dup_recursion");
  goto LAB_00152acc;
  while (plVar20 = (lys_node_list *)lys_parent((lys_node *)node_00), plVar20 != (lys_node_list *)0x0
        ) {
LAB_00152ec4:
    node_00 = plVar20;
    if (node_00 == (lys_node_list *)0x0) goto LAB_00152efb;
    if (node_00->nodetype != LYS_AUGMENT) {
      if (node_00->nodetype != LYS_USES) break;
      plVar20 = (lys_node_list *)node_00->parent;
      goto LAB_00152ec4;
    }
  }
  local_6c = node_00->flags & 3;
LAB_00152efb:
  ctx = local_58;
  if (size2 == 2) {
    uVar10 = plVar13->flags & 0xfff8;
LAB_001534b9:
    plVar13->flags = uVar10;
  }
  else if (size2 == 1) {
    uVar10 = plVar13->flags;
    if ((uVar10 & 4) == 0) {
      if (plVar13->nodetype != LYS_USES) {
        uVar10 = (uVar10 & 0xfff8) + (short)local_6c;
        goto LAB_001534b9;
      }
    }
    else if (((local_6c & 2) != 0) && ((uVar10 & 1) != 0)) {
      ly_vlog(LYE_INARG,LY_VLOG_LYS,plVar13,"true","config");
      ly_vlog(LYE_SPEC,LY_VLOG_PREV,(void *)0x0,
              "State nodes cannot have configuration nodes as children.");
      goto LAB_00152acc;
    }
  }
  iVar11 = lys_node_addchild((lys_node *)list_orig,plVar13->module,plVar13);
  if (iVar11 != 0) goto LAB_00152acc;
  plVar31 = local_50;
  new_item_00 = local_80;
  plVar32 = local_88;
  if ((plVar4->nodetype & (LYS_LEAFLIST|LYS_LEAF)) == LYS_UNKNOWN) {
    pplVar35 = &local_40->child;
    while (plVar4 = *pplVar35, plVar4 != (lys_node *)0x0) {
      if (((plVar4->nodetype & LYS_GROUPING) == LYS_UNKNOWN) &&
         (plVar29 = lys_node_dup_recursion(module,plVar13,plVar4,unres,0,size2), plVar31 = local_50,
         new_item_00 = local_80, plVar32 = local_88, plVar29 == (lys_node *)0x0)) goto LAB_00152acc;
      pplVar35 = &plVar4->next;
    }
  }
  node = local_40;
  if ((((size2 == 1) && (plVar13->nodetype == LYS_LIST)) && ((plVar13->flags & 1) != 0)) &&
     (local_40->padding[2] == '\0')) {
    ly_vlog(LYE_MISSCHILDSTMT,LY_VLOG_LYS,plVar13,"key","list");
    goto LAB_00152acc;
  }
LAB_00152b71:
  LVar3 = node->nodetype;
  switch(LVar3) {
  case LYS_CONTAINER:
    if ((lys_when *)node[1].name != (lys_when *)0x0) {
      plVar23 = lys_when_dup(module,(lys_when *)node[1].name,unres);
      plVar22[1].name = (char *)plVar23;
    }
    pcVar14 = lydict_insert(ctx,*(char **)&node[1].flags,0);
    *(char **)&plVar22[1].flags = pcVar14;
    bVar2 = node->padding[2];
    plVar22->padding[2] = bVar2;
    plVar16 = lys_restr_dup(module,(lys_restr *)node[1].dsc,(uint)bVar2,unres);
    plVar22[1].dsc = (char *)plVar16;
    return plVar13;
  case LYS_CHOICE:
    if ((lys_when *)node[1].name != (lys_when *)0x0) {
      plVar23 = lys_when_dup(module,(lys_when *)node[1].name,unres);
      local_80[1].name = (char *)plVar23;
      new_item_00 = local_80;
    }
    pcVar14 = node[1].dsc;
    if (local_74 != 0) {
      new_item_00[1].dsc = pcVar14;
      return plVar13;
    }
    if (pcVar14 == (char *)0x0) {
      unres_schema_dup(module,unres,node,UNRES_CHOICE_DFLT,new_item_00);
      return plVar13;
    }
    plVar25 = plVar13->module;
    if ((plVar25->field_0x40 & 1) != 0) {
      plVar25 = (lys_module *)plVar25->data;
    }
    iVar11 = lys_get_sibling(new_item_00->child,plVar25->name,0,*(char **)pcVar14,0,0x807d,
                             (lys_node **)&new_item_00[1].dsc);
    if (iVar11 == 0) {
      return plVar13;
    }
    pLVar19 = ly_errno_location();
    *pLVar19 = LY_EINT;
    uVar30 = 0xb9b;
    break;
  case LYS_CHOICE|LYS_CONTAINER:
  case LYS_LEAF|LYS_CONTAINER:
  case LYS_LEAF|LYS_CHOICE:
  case LYS_LEAF|LYS_CHOICE|LYS_CONTAINER:
switchD_00152e37_caseD_3:
    pLVar19 = ly_errno_location();
    *pLVar19 = LY_EINT;
    uVar30 = 0xc4b;
    break;
  case LYS_LEAF:
    local_58 = ctx;
    iVar11 = ingrouping(plVar13);
    iVar11 = lys_type_dup(module,plVar13,(lys_type *)&plVar31[1].ref,(lys_type *)&node[1].ref,iVar11
                          ,unres);
    plVar22 = local_40;
    if (iVar11 == 0) {
      plVar21 = (lys_node *)lydict_insert(module->ctx,(char *)local_40[1].next,0);
      local_50[1].next = plVar21;
      if (plVar22[1].prev != (lys_node *)0x0) {
        plVar22 = (lys_node *)lydict_insert(local_58,(char *)plVar22[1].prev,0);
        local_50[1].prev = plVar22;
        iVar11 = ingrouping(plVar13);
        iVar12._0_2_ = local_50[1].flags;
        iVar12._2_1_ = local_50[1].ext_size;
        iVar12._3_1_ = local_50[1].iffeature_size;
        if (iVar11 == 0 || iVar12 != 9) {
          plVar25 = module;
          if (iVar12 == 7) {
            plVar25 = local_40->module;
          }
          iVar11 = unres_schema_add_node
                             (plVar25,unres,&plVar31[1].ref,UNRES_TYPE_DFLT,
                              (lys_node *)&local_50[1].prev);
          if (iVar11 == -1) goto LAB_00152acc;
        }
      }
      plVar21 = local_40;
      bVar2 = local_40->padding[3];
      local_50->padding[3] = bVar2;
      plVar16 = lys_restr_dup(module,(lys_restr *)local_40[1].dsc,(uint)bVar2,unres);
      plVar22 = local_50;
      local_50[1].dsc = (char *)plVar16;
      if ((lys_when *)plVar21[1].name == (lys_when *)0x0) {
        return plVar13;
      }
      plVar23 = lys_when_dup(module,(lys_when *)plVar21[1].name,unres);
      plVar22[1].name = (char *)plVar23;
      return plVar13;
    }
    goto LAB_00152acc;
  case LYS_LEAFLIST:
    plVar22 = local_48 + 1;
    local_58 = ctx;
    iVar11 = ingrouping(plVar13);
    local_38 = (lys_node *)&plVar22->ref;
    iVar11 = lys_type_dup(module,plVar13,(lys_type *)&plVar22->ref,(lys_type *)&node[1].ref,iVar11,
                          unres);
    plVar22 = local_40;
    if (iVar11 == 0) {
      lVar36 = 0;
      plVar13 = (lys_node *)lydict_insert(module->ctx,(char *)local_40[1].next,0);
      plVar21 = local_48;
      local_48[1].next = plVar13;
      *(undefined4 *)&local_48[1].priv = *(undefined4 *)&plVar22[1].priv;
      *(undefined4 *)((long)&local_48[1].priv + 4) = *(undefined4 *)((long)&plVar22[1].priv + 4);
      bVar2 = plVar22->padding[3];
      local_48->padding[3] = bVar2;
      plVar16 = lys_restr_dup(module,(lys_restr *)plVar22[1].dsc,(uint)bVar2,unres);
      plVar21[1].dsc = (char *)plVar16;
      bVar2 = plVar22->padding[2];
      plVar21->padding[2] = bVar2;
      plVar13 = (lys_node *)malloc((ulong)bVar2 << 3);
      plVar21[1].prev = plVar13;
      uVar34 = 0;
      do {
        if (bVar2 <= uVar34) {
          if ((lys_when *)local_40[1].name == (lys_when *)0x0) {
            return local_60;
          }
          plVar23 = lys_when_dup(local_68,(lys_when *)local_40[1].name,unres);
          plVar21[1].name = (char *)plVar23;
          return local_60;
        }
        pcVar14 = lydict_insert(local_58,*(char **)((local_40[1].prev)->padding + lVar36 + -0x1c),0)
        ;
        *(char **)((plVar21[1].prev)->padding + lVar36 + -0x1c) = pcVar14;
        iVar12 = ingrouping(local_60);
        iVar11._0_2_ = plVar21[1].flags;
        iVar11._2_1_ = plVar21[1].ext_size;
        iVar11._3_1_ = plVar21[1].iffeature_size;
        if (iVar12 == 0 || iVar11 != 9) {
          plVar13 = plVar21[1].prev;
          if (((iVar11 != 7) ||
              (pcVar14 = strchr(*(char **)(plVar13->padding + lVar36 + -0x1c),0x3a),
              pcVar14 != (char *)0x0)) || (plVar25 = local_40->module, plVar25 == local_68)) {
            plVar25 = local_68;
          }
          iVar11 = unres_schema_add_node
                             (plVar25,unres,local_38,UNRES_TYPE_DFLT,
                              (lys_node *)(plVar13->padding + lVar36 + -0x1c));
          plVar13 = local_60;
          if (iVar11 == -1) break;
        }
        uVar34 = uVar34 + 1;
        bVar2 = plVar21->padding[2];
        lVar36 = lVar36 + 8;
      } while( true );
    }
    goto LAB_00152acc;
  default:
    if (LVar3 != LYS_LIST) {
      if (LVar3 != LYS_ANYXML) {
        if (LVar3 == LYS_CASE) {
          if ((lys_when *)node[1].name == (lys_when *)0x0) {
            return plVar13;
          }
          plVar23 = lys_when_dup(module,(lys_when *)node[1].name,unres);
          local_38 = plVar17;
          goto LAB_0015320a;
        }
        if (LVar3 == LYS_NOTIF) {
          return plVar13;
        }
        if (LVar3 == LYS_RPC) {
          return plVar13;
        }
        if (LVar3 == LYS_INPUT) {
          return plVar13;
        }
        if (LVar3 == LYS_OUTPUT) {
          return plVar13;
        }
        if (LVar3 == LYS_USES) {
          uVar1 = node[1].ext_size;
          uVar5 = node[1].iffeature_size;
          uVar6 = node[1].padding[0];
          uVar7 = node[1].padding[1];
          uVar8 = node[1].padding[2];
          uVar9 = node[1].padding[3];
          plVar32[1].flags = node[1].flags;
          plVar32[1].ext_size = uVar1;
          plVar32[1].iffeature_size = uVar5;
          plVar32[1].padding[0] = uVar6;
          plVar32[1].padding[1] = uVar7;
          plVar32[1].padding[2] = uVar8;
          plVar32[1].padding[3] = uVar9;
          plVar23 = (lys_when *)node[1].name;
          goto joined_r0x00152c15;
        }
        if (LVar3 == LYS_ACTION) {
          return plVar13;
        }
        if (LVar3 != LYS_ANYDATA) goto switchD_00152e37_caseD_3;
      }
      bVar2 = node->padding[3];
      plVar21->padding[3] = bVar2;
      plVar16 = lys_restr_dup(module,(lys_restr *)node[1].dsc,(uint)bVar2,unres);
      plVar21[1].dsc = (char *)plVar16;
      plVar23 = (lys_when *)node[1].name;
      plVar32 = plVar21;
joined_r0x00152c15:
      if (plVar23 == (lys_when *)0x0) {
        return plVar13;
      }
      plVar23 = lys_when_dup(module,plVar23,unres);
      plVar32[1].name = (char *)plVar23;
      return plVar13;
    }
    *(undefined4 *)&local_38[1].iffeature = *(undefined4 *)&node[1].iffeature;
    *(undefined4 *)((long)&local_38[1].iffeature + 4) =
         *(undefined4 *)((long)&node[1].iffeature + 4);
    bVar2 = node->padding[0];
    local_38->padding[0] = bVar2;
    plVar16 = lys_restr_dup(module,(lys_restr *)node[1].dsc,(uint)bVar2,unres);
    local_38[1].dsc = (char *)plVar16;
    bVar2 = node->padding[2];
    local_38->padding[2] = bVar2;
    if ((ulong)bVar2 != 0) {
      pvVar24 = calloc((ulong)bVar2,8);
      *(void **)&local_38[1].flags = pvVar24;
      plVar25 = (lys_module *)lydict_insert(ctx,(char *)node[1].module,0);
      local_38[1].module = plVar25;
      if (*(void **)&local_38[1].flags == (void *)0x0) goto LAB_00153420;
      plVar20 = list_orig;
      if (local_74 == 0) {
        for (; plVar20 != (lys_node_list *)0x0; plVar20 = (lys_node_list *)plVar20->parent) {
          if (plVar20->nodetype == LYS_GROUPING) goto LAB_001532f0;
        }
        iVar11 = unres_schema_add_node(module,unres,local_38,UNRES_LIST_KEYS,(lys_node *)0x0);
        if (iVar11 == -1) goto LAB_00152acc;
      }
      else {
        memcpy(*(void **)&local_38[1].flags,*(void **)&node[1].flags,
               (ulong)local_38->padding[2] << 3);
      }
    }
LAB_001532f0:
    plVar22 = local_38;
    bVar2 = node->padding[3];
    local_38->padding[3] = bVar2;
    local_58 = ctx;
    pplVar26 = (lys_ext_instance **)malloc((ulong)bVar2 << 4);
    plVar22[1].ext = pplVar26;
    if (pplVar26 != (lys_ext_instance **)0x0) {
      plVar22 = (lys_node *)0x0;
      while (plVar22 < (lys_node *)(ulong)bVar2) {
        bVar2 = *(byte *)(plStack_98[1].ext + (long)plVar22 * 2 + 1);
        *(byte *)(pplVar26 + (long)plVar22 * 2 + 1) = bVar2;
        local_40 = plVar22;
        plVar27 = (lys_ext_instance *)malloc((ulong)bVar2 << 3);
        pplVar26[(long)plVar22 * 2] = plVar27;
        if (plVar27 == (lys_ext_instance *)0x0) goto LAB_00153420;
        for (uVar34 = 0; uVar34 < bVar2; uVar34 = uVar34 + 1) {
          plVar28 = (lys_ext *)
                    lydict_insert(local_58,(char *)(&plStack_98[1].ext[(long)plVar22 * 2]->def)
                                                   [uVar34],0);
          plVar13 = local_38;
          (&local_38[1].ext[(long)plVar22 * 2]->def)[uVar34] = plVar28;
          new_item = (undefined8 *)malloc(0x18);
          *new_item = plVar13;
          pplVar26 = plVar13[1].ext;
          new_item[1] = (&pplVar26[(long)plVar22 * 2]->def)[uVar34];
          new_item[2] = (long)(pplVar26 + (long)plVar22 * 2) + 9;
          unres_schema_dup(local_68,unres,&stack0xffffffffffffff68,UNRES_LIST_UNIQ,new_item);
          pplVar26 = plVar13[1].ext;
          bVar2 = *(byte *)(pplVar26 + (long)plVar22 * 2 + 1);
        }
        bVar2 = local_38->padding[3];
        plVar13 = local_60;
        plVar22 = (lys_node *)((long)&local_40->name + 1);
      }
      if ((lys_when *)plStack_98[1].name == (lys_when *)0x0) {
        return plVar13;
      }
      plVar23 = lys_when_dup(local_68,(lys_when *)plStack_98[1].name,unres);
LAB_0015320a:
      local_38[1].name = (char *)plVar23;
      return plVar13;
    }
    goto LAB_00153420;
  }
LAB_001529b2:
  ly_log(LY_LLERR,"Internal error (%s:%d).",
         "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/tree_schema.c"
         ,uVar30);
LAB_00152acc:
  lys_node_free(plVar13,(_func_void_lys_node_ptr_void_ptr *)0x0,0);
  return (lys_node *)0x0;
}

Assistant:

static struct lys_node *
lys_node_dup_recursion(struct lys_module *module, struct lys_node *parent, const struct lys_node *node,
                       struct unres_schema *unres, int shallow, int finalize)
{
    struct lys_node *retval = NULL, *iter, *p;
    struct lys_module *tmp_mod;
    struct ly_ctx *ctx = module->ctx;
    int i, j, rc;
    unsigned int size, size1, size2;
    struct unres_list_uniq *unique_info;
    uint16_t flags;

    struct lys_node_container *cont = NULL;
    struct lys_node_container *cont_orig = (struct lys_node_container *)node;
    struct lys_node_choice *choice = NULL;
    struct lys_node_choice *choice_orig = (struct lys_node_choice *)node;
    struct lys_node_leaf *leaf = NULL;
    struct lys_node_leaf *leaf_orig = (struct lys_node_leaf *)node;
    struct lys_node_leaflist *llist = NULL;
    struct lys_node_leaflist *llist_orig = (struct lys_node_leaflist *)node;
    struct lys_node_list *list = NULL;
    struct lys_node_list *list_orig = (struct lys_node_list *)node;
    struct lys_node_anydata *any = NULL;
    struct lys_node_anydata *any_orig = (struct lys_node_anydata *)node;
    struct lys_node_uses *uses = NULL;
    struct lys_node_uses *uses_orig = (struct lys_node_uses *)node;
    struct lys_node_rpc_action *rpc = NULL;
    struct lys_node_inout *io = NULL;
    struct lys_node_notif *ntf = NULL;
    struct lys_node_case *cs = NULL;
    struct lys_node_case *cs_orig = (struct lys_node_case *)node;

    /* we cannot just duplicate memory since the strings are stored in
     * dictionary and we need to update dictionary counters.
     */

    switch (node->nodetype) {
    case LYS_CONTAINER:
        cont = calloc(1, sizeof *cont);
        retval = (struct lys_node *)cont;
        break;

    case LYS_CHOICE:
        choice = calloc(1, sizeof *choice);
        retval = (struct lys_node *)choice;
        break;

    case LYS_LEAF:
        leaf = calloc(1, sizeof *leaf);
        retval = (struct lys_node *)leaf;
        break;

    case LYS_LEAFLIST:
        llist = calloc(1, sizeof *llist);
        retval = (struct lys_node *)llist;
        break;

    case LYS_LIST:
        list = calloc(1, sizeof *list);
        retval = (struct lys_node *)list;
        break;

    case LYS_ANYXML:
    case LYS_ANYDATA:
        any = calloc(1, sizeof *any);
        retval = (struct lys_node *)any;
        break;

    case LYS_USES:
        uses = calloc(1, sizeof *uses);
        retval = (struct lys_node *)uses;
        break;

    case LYS_CASE:
        cs = calloc(1, sizeof *cs);
        retval = (struct lys_node *)cs;
        break;

    case LYS_RPC:
    case LYS_ACTION:
        rpc = calloc(1, sizeof *rpc);
        retval = (struct lys_node *)rpc;
        break;

    case LYS_INPUT:
    case LYS_OUTPUT:
        io = calloc(1, sizeof *io);
        retval = (struct lys_node *)io;
        break;

    case LYS_NOTIF:
        ntf = calloc(1, sizeof *ntf);
        retval = (struct lys_node *)ntf;
        break;

    default:
        LOGINT;
        goto error;
    }

    if (!retval) {
        LOGMEM;
        return NULL;
    }

    /*
     * duplicate generic part of the structure
     */
    retval->name = lydict_insert(ctx, node->name, 0);
    retval->dsc = lydict_insert(ctx, node->dsc, 0);
    retval->ref = lydict_insert(ctx, node->ref, 0);
    retval->flags = node->flags;

    retval->module = module;
    retval->nodetype = node->nodetype;

    retval->prev = retval;

    retval->ext_size = node->ext_size;
    if (lys_ext_dup(module, node->ext, node->ext_size, retval, LYEXT_PAR_NODE, &retval->ext, unres)) {
        goto error;
    }

    if (node->iffeature_size) {
        retval->iffeature_size = node->iffeature_size;
        retval->iffeature = calloc(retval->iffeature_size, sizeof *retval->iffeature);
        if (!retval->iffeature) {
            LOGMEM;
            goto error;
        }
    }

    if (!shallow) {
        for (i = 0; i < node->iffeature_size; ++i) {
            resolve_iffeature_getsizes(&node->iffeature[i], &size1, &size2);
            if (size1) {
                /* there is something to duplicate */

                /* duplicate compiled expression */
                size = (size1 / 4) + (size1 % 4) ? 1 : 0;
                retval->iffeature[i].expr = malloc(size * sizeof *retval->iffeature[i].expr);
                memcpy(retval->iffeature[i].expr, node->iffeature[i].expr, size * sizeof *retval->iffeature[i].expr);

                /* list of feature pointer must be updated to point to the resulting tree */
                retval->iffeature[i].features = calloc(size2, sizeof *retval->iffeature[i].features);
                for (j = 0; (unsigned int)j < size2; j++) {
                    rc = unres_schema_dup(module, unres, &node->iffeature[i].features[j], UNRES_IFFEAT,
                                          &retval->iffeature[i].features[j]);
                    if (rc == EXIT_FAILURE) {
                        /* feature is resolved in origin, so copy it
                         * - duplication is used for instantiating groupings
                         * and if-feature inside grouping is supposed to be
                         * resolved inside the original grouping, so we want
                         * to keep pointers to features from the grouping
                         * context */
                        retval->iffeature[i].features[j] = node->iffeature[i].features[j];
                    } else if (rc == -1) {
                        goto error;
                    } /* else unres was duplicated */
                }
            }

            /* duplicate if-feature's extensions */
            retval->iffeature[i].ext_size = node->iffeature[i].ext_size;
            if (lys_ext_dup(module, node->iffeature[i].ext, node->iffeature[i].ext_size,
                            &retval->iffeature[i], LYEXT_PAR_IFFEATURE, &retval->iffeature[i].ext, unres)) {
                goto error;
            }
        }

        /* inherit config flags */
        p = parent;
        do {
            for (iter = p; iter && (iter->nodetype == LYS_USES); iter = iter->parent);
        } while (iter && iter->nodetype == LYS_AUGMENT && (p = lys_parent(iter)));
        if (iter) {
            flags = iter->flags & LYS_CONFIG_MASK;
        } else {
            /* default */
            flags = LYS_CONFIG_W;
        }

        switch (finalize) {
        case 1:
            /* inherit config flags */
            if (retval->flags & LYS_CONFIG_SET) {
                /* skip nodes with an explicit config value */
                if ((flags & LYS_CONFIG_R) && (retval->flags & LYS_CONFIG_W)) {
                    LOGVAL(LYE_INARG, LY_VLOG_LYS, retval, "true", "config");
                    LOGVAL(LYE_SPEC, LY_VLOG_PREV, NULL, "State nodes cannot have configuration nodes as children.");
                    goto error;
                }
                break;
            }

            if (retval->nodetype != LYS_USES) {
                retval->flags = (retval->flags & ~LYS_CONFIG_MASK) | flags;
            }
            break;
        case 2:
            /* erase config flags */
            retval->flags &= ~LYS_CONFIG_MASK;
            retval->flags &= ~LYS_CONFIG_SET;
            break;
        }

        /* connect it to the parent */
        if (lys_node_addchild(parent, retval->module, retval)) {
            goto error;
        }

        /* go recursively */
        if (!(node->nodetype & (LYS_LEAF | LYS_LEAFLIST))) {
            LY_TREE_FOR(node->child, iter) {
                if (iter->nodetype & LYS_GROUPING) {
                    /* do not instantiate groupings */
                    continue;
                }
                if (!lys_node_dup_recursion(module, retval, iter, unres, 0, finalize)) {
                    goto error;
                }
            }
        }

        if (finalize == 1) {
            /* check that configuration lists have keys
             * - we really want to check keys_size in original node, because the keys are
             * not yet resolved here, it is done below in nodetype specific part */
            if ((retval->nodetype == LYS_LIST) && (retval->flags & LYS_CONFIG_W)
                    && !((struct lys_node_list *)node)->keys_size) {
                LOGVAL(LYE_MISSCHILDSTMT, LY_VLOG_LYS, retval, "key", "list");
                goto error;
            }
        }
    } else {
        memcpy(retval->iffeature, node->iffeature, retval->iffeature_size * sizeof *retval->iffeature);
    }

    /*
     * duplicate specific part of the structure
     */
    switch (node->nodetype) {
    case LYS_CONTAINER:
        if (cont_orig->when) {
            cont->when = lys_when_dup(module, cont_orig->when, unres);
        }
        cont->presence = lydict_insert(ctx, cont_orig->presence, 0);

        cont->must_size = cont_orig->must_size;
        cont->must = lys_restr_dup(module, cont_orig->must, cont->must_size, unres);

        /* typedefs are not needed in instantiated grouping, nor the deviation's shallow copy */

        break;
    case LYS_CHOICE:
        if (choice_orig->when) {
            choice->when = lys_when_dup(module, choice_orig->when, unres);
        }

        if (!shallow) {
            if (choice_orig->dflt) {
                rc = lys_get_sibling(choice->child, lys_node_module(retval)->name, 0, choice_orig->dflt->name, 0,
                                            LYS_ANYDATA | LYS_CASE | LYS_CONTAINER | LYS_LEAF | LYS_LEAFLIST | LYS_LIST,
                                            (const struct lys_node **)&choice->dflt);
                if (rc) {
                    if (rc == EXIT_FAILURE) {
                        LOGINT;
                    }
                    goto error;
                }
            } else {
                /* useless to check return value, we don't know whether
                * there really wasn't any default defined or it just hasn't
                * been resolved, we just hope for the best :)
                */
                unres_schema_dup(module, unres, choice_orig, UNRES_CHOICE_DFLT, choice);
            }
        } else {
            choice->dflt = choice_orig->dflt;
        }
        break;

    case LYS_LEAF:
        if (lys_type_dup(module, retval, &(leaf->type), &(leaf_orig->type), ingrouping(retval), unres)) {
            goto error;
        }
        leaf->units = lydict_insert(module->ctx, leaf_orig->units, 0);

        if (leaf_orig->dflt) {
            leaf->dflt = lydict_insert(ctx, leaf_orig->dflt, 0);
            if (!ingrouping(retval) || (leaf->type.base != LY_TYPE_LEAFREF)) {
                /* problem is when it is an identityref referencing an identity from a module
                 * and we are using the grouping in a different module */
                if (leaf->type.base == LY_TYPE_IDENT) {
                    tmp_mod = leaf_orig->module;
                } else {
                    tmp_mod = module;
                }
                if (unres_schema_add_node(tmp_mod, unres, &leaf->type, UNRES_TYPE_DFLT,
                                          (struct lys_node *)(&leaf->dflt)) == -1) {
                    goto error;
                }
            }
        }

        leaf->must_size = leaf_orig->must_size;
        leaf->must = lys_restr_dup(module, leaf_orig->must, leaf->must_size, unres);

        if (leaf_orig->when) {
            leaf->when = lys_when_dup(module, leaf_orig->when, unres);
        }
        break;

    case LYS_LEAFLIST:
        if (lys_type_dup(module, retval, &(llist->type), &(llist_orig->type), ingrouping(retval), unres)) {
            goto error;
        }
        llist->units = lydict_insert(module->ctx, llist_orig->units, 0);

        llist->min = llist_orig->min;
        llist->max = llist_orig->max;

        llist->must_size = llist_orig->must_size;
        llist->must = lys_restr_dup(module, llist_orig->must, llist->must_size, unres);

        llist->dflt_size = llist_orig->dflt_size;
        llist->dflt = malloc(llist->dflt_size * sizeof *llist->dflt);
        for (i = 0; i < llist->dflt_size; i++) {
            llist->dflt[i] = lydict_insert(ctx, llist_orig->dflt[i], 0);
            if (!ingrouping(retval) || (llist->type.base != LY_TYPE_LEAFREF)) {
                if ((llist->type.base == LY_TYPE_IDENT) && !strchr(llist->dflt[i], ':') && (module != llist_orig->module)) {
                    tmp_mod = llist_orig->module;
                } else {
                    tmp_mod = module;
                }
                if (unres_schema_add_node(tmp_mod, unres, &llist->type, UNRES_TYPE_DFLT,
                                          (struct lys_node *)(&llist->dflt[i])) == -1) {
                    goto error;
                }
            }
        }

        if (llist_orig->when) {
            llist->when = lys_when_dup(module, llist_orig->when, unres);
        }
        break;

    case LYS_LIST:
        list->min = list_orig->min;
        list->max = list_orig->max;

        list->must_size = list_orig->must_size;
        list->must = lys_restr_dup(module, list_orig->must, list->must_size, unres);

        /* typedefs are not needed in instantiated grouping, nor the deviation's shallow copy */

        list->keys_size = list_orig->keys_size;
        if (list->keys_size) {
            list->keys = calloc(list->keys_size, sizeof *list->keys);
            list->keys_str = lydict_insert(ctx, list_orig->keys_str, 0);
            if (!list->keys) {
                LOGMEM;
                goto error;
            }

            if (!shallow) {
                /* the keys are going to be resolved only if the list is instantiated in data tree, not just
                 * in another grouping */
                for (iter = parent; iter && iter->nodetype != LYS_GROUPING; iter = iter->parent);
                if (!iter && unres_schema_add_node(module, unres, list, UNRES_LIST_KEYS, NULL) == -1) {
                    goto error;
                }
            } else {
                memcpy(list->keys, list_orig->keys, list->keys_size * sizeof *list->keys);
            }
        }

        list->unique_size = list_orig->unique_size;
        list->unique = malloc(list->unique_size * sizeof *list->unique);
        if (!list->unique) {
            LOGMEM;
            goto error;
        }
        for (i = 0; i < list->unique_size; ++i) {
            list->unique[i].expr_size = list_orig->unique[i].expr_size;
            list->unique[i].expr = malloc(list->unique[i].expr_size * sizeof *list->unique[i].expr);
            if (!list->unique[i].expr) {
                LOGMEM;
                goto error;
            }
            for (j = 0; j < list->unique[i].expr_size; j++) {
                list->unique[i].expr[j] = lydict_insert(ctx, list_orig->unique[i].expr[j], 0);

                /* if it stays in unres list, duplicate it also there */
                unique_info = malloc(sizeof *unique_info);
                unique_info->list = (struct lys_node *)list;
                unique_info->expr = list->unique[i].expr[j];
                unique_info->trg_type = &list->unique[i].trg_type;
                unres_schema_dup(module, unres, &list_orig, UNRES_LIST_UNIQ, unique_info);
            }
        }

        if (list_orig->when) {
            list->when = lys_when_dup(module, list_orig->when, unres);
        }
        break;

    case LYS_ANYXML:
    case LYS_ANYDATA:
        any->must_size = any_orig->must_size;
        any->must = lys_restr_dup(module, any_orig->must, any->must_size, unres);

        if (any_orig->when) {
            any->when = lys_when_dup(module, any_orig->when, unres);
        }
        break;

    case LYS_USES:
        uses->grp = uses_orig->grp;

        if (uses_orig->when) {
            uses->when = lys_when_dup(module, uses_orig->when, unres);
        }
        /* it is not needed to duplicate refine, nor augment. They are already applied to the uses children */
        break;

    case LYS_CASE:
        if (cs_orig->when) {
            cs->when = lys_when_dup(module, cs_orig->when, unres);
        }
        break;

    case LYS_ACTION:
    case LYS_RPC:
    case LYS_INPUT:
    case LYS_OUTPUT:
    case LYS_NOTIF:
        /* typedefs are not needed in instantiated grouping, nor the deviation's shallow copy */
        break;

    default:
        /* LY_NODE_AUGMENT */
        LOGINT;
        goto error;
    }

    return retval;

error:

    lys_node_free(retval, NULL, 0);
    return NULL;
}